

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFieldsToString
          (Printer *this,UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  StringOutputStream output_stream;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&output_stream,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x47d);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)&output_stream,"CHECK failed: output: ")
    ;
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&output_stream);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&output_stream,output);
  bVar1 = PrintUnknownFields(this,unknown_fields,&output_stream.super_ZeroCopyOutputStream);
  io::StringOutputStream::~StringOutputStream(&output_stream);
  return bVar1;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields,
    string* output) const {
  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);
  return PrintUnknownFields(unknown_fields, &output_stream);
}